

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O1

Nonnull<char_*>
absl::lts_20250127::numbers_internal::FastIntToBuffer(uint64_t i,Nonnull<char_*> buffer)

{
  undefined1 auVar1 [16];
  uint uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  long *plVar7;
  uint uVar8;
  ulong uVar9;
  
  if (i >> 0x20 == 0) {
    if (i < 10) {
      *buffer = (byte)i | 0x30;
      plVar7 = (long *)(buffer + 1);
      goto LAB_0023d48f;
    }
    uVar6 = i & 0xffffffff;
    if (99999999 < i) {
      uVar2 = (uint)(uVar6 / 100000000);
      uVar8 = (int)i + uVar2 * -100000000;
      uVar9 = (ulong)uVar8 * 0x68db8bb;
      uVar9 = (ulong)(uVar8 + (uint)(uVar9 >> 0x28) * -10000) << 0x20 | uVar9 >> 0x28;
      lVar5 = (uVar9 * 0x28f6 >> 0x14 & 0x7f0000007f) * -0x63ffff + uVar9 * 0x10000;
      uVar9 = (ulong)(lVar5 * 0x67) >> 10 & 0xf000f000f000f;
      iVar3 = (int)(uVar6 / 100000000) + -10;
      iVar4 = iVar3 >> 8;
      *(short *)buffer =
           (short)((int)(uVar6 / 100000000) * 0x100 + (uVar2 / 10) * -0x9ff + 0x3030 >>
                  ((byte)((uint)iVar3 >> 8) & 8));
      plVar7 = (long *)(buffer + (long)iVar4 + 10);
      *(ulong *)(buffer + (long)iVar4 + 2) =
           (uVar9 | 0x3030303030303030) + (uVar9 * 0xfffffffffffff6 + lVar5) * 0x100;
      goto LAB_0023d48f;
    }
    uVar6 = (ulong)(uint)((int)i + (int)(uVar6 / 10000) * -10000) << 0x20 | uVar6 / 10000;
    lVar5 = (uVar6 * 0x28f6 >> 0x14 & 0x7f0000007f) * -0x63ffff + uVar6 * 0x10000;
    uVar6 = ((ulong)(lVar5 * 0x67) >> 10 & 0xf000f000f000f) * -0x9ff + lVar5 * 0x100;
    if (uVar6 == 0) goto LAB_0023d5fc;
    uVar9 = 0;
    if (uVar6 != 0) {
      for (; (uVar6 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
      }
    }
    *(ulong *)buffer = uVar6 + 0x3030303030303030 >> ((byte)uVar9 & 0x38);
    plVar7 = (long *)(buffer + -(uVar9 >> 3 & 0x1fffffff));
  }
  else {
    if (i < 10000000000000000) {
      uVar6 = i / 100000000 & 0xffffffff;
      uVar6 = (ulong)(uint)((int)(i / 100000000) + (int)(uVar6 / 10000) * -10000) << 0x20 |
              uVar6 / 10000;
      lVar5 = (uVar6 * 0x28f6 >> 0x14 & 0x7f0000007f) * -0x63ffff + uVar6 * 0x10000;
      uVar6 = ((ulong)(lVar5 * 0x67) >> 10 & 0xf000f000f000f) * -0x9ff + lVar5 * 0x100;
      if (uVar6 == 0) {
LAB_0023d5fc:
        __assert_fail("bottom != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/numbers.cc"
                      ,0xf5,
                      "absl::Nonnull<char *> absl::lts_20250127::(anonymous namespace)::EncodeFullU32(uint32_t, absl::Nonnull<char *>)"
                     );
      }
      uVar9 = 0;
      if (uVar6 != 0) {
        for (; (uVar6 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
        }
      }
      *(ulong *)buffer = uVar6 + 0x3030303030303030 >> ((byte)uVar9 & 0x38);
      lVar5 = 8 - (uVar9 >> 3 & 0x1fffffff);
    }
    else {
      uVar2 = (uint)(i / 10000000000000000);
      uVar2 = (uVar2 % 100) * 0x10000 | uVar2 / 100;
      uVar2 = (uVar2 * 0x67 >> 10 & 0xf000f) * -0x9ff + uVar2 * 0x100;
      if (uVar2 == 0) {
        __assert_fail("tens != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/numbers.cc"
                      ,0xc1,
                      "char *absl::lts_20250127::(anonymous namespace)::EncodeTenThousand(uint32_t, absl::Nonnull<char *>)"
                     );
      }
      auVar1._8_8_ = 0;
      auVar1._0_8_ = i / 100000000;
      lVar5 = i / 100000000 + (ulong)(SUB164(auVar1 * ZEXT816(0x55e63b88c3),8) >> 1) * -100000000;
      uVar6 = lVar5 * 0x68db8bb;
      uVar6 = (ulong)((int)lVar5 + (uint)(uVar6 >> 0x28) * -10000) << 0x20 | uVar6 >> 0x28;
      lVar5 = (uVar6 * 0x28f6 >> 0x14 & 0x7f0000007f) * -0x63ffff + uVar6 * 0x10000;
      uVar6 = (ulong)(lVar5 * 0x67) >> 10 & 0xf000f000f000f;
      uVar8 = 0;
      if (uVar2 != 0) {
        for (; (uVar2 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
        }
      }
      *(uint *)buffer = uVar2 + 0x30303030 >> ((byte)uVar8 & 0x18);
      *(ulong *)(buffer + (4 - (ulong)(uVar8 >> 3))) =
           (uVar6 | 0x3030303030303030) + (uVar6 * 0xfffffffffffff6 + lVar5) * 0x100;
      lVar5 = 0xc - (ulong)(uVar8 >> 3);
    }
    plVar7 = (long *)(buffer + lVar5);
    uVar6 = i % 100000000;
    uVar6 = (ulong)(uint)((int)uVar6 + (int)(uVar6 / 10000) * -10000) << 0x20 | uVar6 / 10000;
    lVar5 = (uVar6 * 0x28f6 >> 0x14 & 0x7f0000007f) * -0x63ffff + uVar6 * 0x10000;
    uVar6 = (ulong)(lVar5 * 0x67) >> 10 & 0xf000f000f000f;
    *plVar7 = (uVar6 | 0x3030303030303030) + (uVar6 * 0xfffffffffffff6 + lVar5) * 0x100;
  }
  plVar7 = plVar7 + 1;
LAB_0023d48f:
  *(undefined1 *)plVar7 = 0;
  return (Nonnull<char_*>)plVar7;
}

Assistant:

inline ABSL_ATTRIBUTE_ALWAYS_INLINE char* EncodeFullU64(uint64_t i,
                                                        char* buffer) {
  if (i <= std::numeric_limits<uint32_t>::max()) {
    return EncodeFullU32(static_cast<uint32_t>(i), buffer);
  }
  uint32_t mod08;
  if (i < 1'0000'0000'0000'0000ull) {
    uint32_t div08 = static_cast<uint32_t>(i / 100'000'000ull);
    mod08 =  static_cast<uint32_t>(i % 100'000'000ull);
    buffer = EncodeFullU32(div08, buffer);
  } else {
    uint64_t div08 = i / 100'000'000ull;
    mod08 =  static_cast<uint32_t>(i % 100'000'000ull);
    uint32_t div016 = static_cast<uint32_t>(div08 / 100'000'000ull);
    uint32_t div08mod08 = static_cast<uint32_t>(div08 % 100'000'000ull);
    uint64_t mid_result = PrepareEightDigits(div08mod08) + kEightZeroBytes;
    buffer = EncodeTenThousand(div016, buffer);
    little_endian::Store64(buffer, mid_result);
    buffer += sizeof(mid_result);
  }
  uint64_t mod_result = PrepareEightDigits(mod08) + kEightZeroBytes;
  little_endian::Store64(buffer, mod_result);
  return buffer + sizeof(mod_result);
}